

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_cpu_features.c
# Opt level: O1

Node * CreatePrintfString(char *format,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Node *pNVar4;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *__maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arglist;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_c8 = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d0 = &arglist[0].overflow_arg_area;
  local_d8 = 0x3000000008;
  __maxlen = (undefined8 *)CONCAT44(gBumpAllocator.size._4_4_,(int)gBumpAllocator.size);
  pcVar3 = gBumpAllocator.ptr;
  local_b0 = in_RSI;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  uVar1 = vsnprintf(gBumpAllocator.ptr,(size_t)__maxlen,"%s",&local_d8);
  if ((-1 < (int)uVar1) && ((int)uVar1 < (int)gBumpAllocator.size)) {
    pcVar3 = (char *)BA_Bump((ulong)uVar1);
    pNVar4 = (Node *)BA_Bump(0x20);
    pNVar4->type = NT_STRING;
    *(undefined8 *)&pNVar4->integer = 0;
    *(undefined8 *)((long)&pNVar4->string + 4) = 0;
    pNVar4->value = (Node *)0x0;
    pNVar4->next = (Node *)0x0;
    pNVar4->string = pcVar3;
    return pNVar4;
  }
  CreatePrintfString_cold_1();
  iVar2 = strcmp(*(char **)pcVar3,(char *)*__maxlen);
  return (Node *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static Node* CreatePrintfString(const char* format, ...) {
  va_list arglist;
  va_start(arglist, format);
  char* const ptr = gBumpAllocator.ptr;
  const int written = vsnprintf(ptr, gBumpAllocator.size, format, arglist);
  va_end(arglist);
  if (written < 0 || written >= (int)gBumpAllocator.size) internal_error();
  return CreateConstantString((char*)BA_Bump(written));
}